

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_GetCVar(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  bool bVar1;
  float fVar2;
  FBaseCVar *pFVar3;
  char *pcVar4;
  AActor *activator;
  double val;
  FString cvarname;
  
  if (numret < 1) {
    return 0;
  }
  if (ret == (VMReturn *)0x0) {
    __assert_fail("ret != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x28a,"int AF_AActor_GetCVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003d82e3;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    activator = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (activator != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)activator,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d82e3;
        }
        goto LAB_003d8240;
      }
    }
    else if (activator != (AActor *)0x0) goto LAB_003d82b4;
    activator = (AActor *)0x0;
LAB_003d8240:
    if (numparam == 1) {
      pcVar4 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\x02') {
        FString::AttachToOther(&cvarname,(FString *)(param + 1));
        pFVar3 = GetCVar(activator,cvarname.Chars);
        if (pFVar3 == (FBaseCVar *)0x0) {
          val = 0.0;
        }
        else {
          fVar2 = (float)(*pFVar3->_vptr_FBaseCVar[4])(pFVar3,2);
          val = (double)fVar2;
        }
        VMReturn::SetFloat(ret,val);
        FString::~FString(&cvarname);
        return 1;
      }
      pcVar4 = "param[paramnum].Type == REGT_STRING";
    }
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x28c,"int AF_AActor_GetCVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003d82b4:
  pcVar4 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003d82e3:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x28b,"int AF_AActor_GetCVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, GetCVar)
{
	if (numret > 0)
	{
		assert(ret != nullptr);
		PARAM_SELF_PROLOGUE(AActor);
		PARAM_STRING(cvarname);

		FBaseCVar *cvar = GetCVar(self, cvarname);
		if (cvar == nullptr)
		{
			ret->SetFloat(0);
		}
		else
		{
			ret->SetFloat(cvar->GetGenericRep(CVAR_Float).Float);
		}
		return 1;
	}
	return 0;
}